

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BlockEventExpressionSyntax *args_2;
  BinaryBlockEventExpressionSyntax *pBVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  BumpAllocator *in_stack_ffffffffffffffc8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  not_null<slang::syntax::BlockEventExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::BlockEventExpressionSyntax_*> *)0x940616);
  args_2 = deepClone<slang::syntax::BlockEventExpressionSyntax>
                     ((BlockEventExpressionSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  not_null<slang::syntax::BlockEventExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::BlockEventExpressionSyntax_*> *)0x940653);
  deepClone<slang::syntax::BlockEventExpressionSyntax>
            ((BlockEventExpressionSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BinaryBlockEventExpressionSyntax,slang::syntax::BlockEventExpressionSyntax&,slang::parsing::Token,slang::syntax::BlockEventExpressionSyntax&>
                     (this,(BlockEventExpressionSyntax *)TVar2.info,TVar2._0_8_,args_2);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BinaryBlockEventExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BinaryBlockEventExpressionSyntax>(
        *deepClone<BlockEventExpressionSyntax>(*node.left, alloc),
        node.orKeyword.deepClone(alloc),
        *deepClone<BlockEventExpressionSyntax>(*node.right, alloc)
    );
}